

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

void __thiscall cmCTestRunTest::DartProcessing(cmCTestRunTest *this)

{
  cmCTestTestHandler *pcVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  string local_50;
  string local_30;
  cmCTestRunTest *local_10;
  cmCTestRunTest *this_local;
  
  local_10 = this;
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) &&
     (lVar4 = std::__cxx11::string::find((char *)&this->ProcessOutput,0xba2e67), lVar4 != -1)) {
    pcVar1 = this->TestHandler;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::RegularExpression::find(&pcVar1->DartStuff,pcVar5);
    if (bVar2) {
      cmsys::RegularExpression::match_abi_cxx11_(&local_30,&this->TestHandler->DartStuff,1);
      std::__cxx11::string::operator=((string *)&(this->TestResult).DartString,(string *)&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      while( true ) {
        pcVar1 = this->TestHandler;
        pcVar5 = (char *)std::__cxx11::string::c_str();
        bVar2 = cmsys::RegularExpression::find(&pcVar1->DartStuff1,pcVar5);
        if (!bVar2) break;
        cmsys::RegularExpression::match_abi_cxx11_(&local_50,&this->TestHandler->DartStuff1,1);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmsys::SystemTools::ReplaceString(&this->ProcessOutput,pcVar5,"");
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
  }
  return;
}

Assistant:

void cmCTestRunTest::DartProcessing()
{
  if (!this->ProcessOutput.empty() &&
      this->ProcessOutput.find("<DartMeasurement") != std::string::npos) {
    if (this->TestHandler->DartStuff.find(this->ProcessOutput.c_str())) {
      this->TestResult.DartString = this->TestHandler->DartStuff.match(1);
      // keep searching and replacing until none are left
      while (this->TestHandler->DartStuff1.find(this->ProcessOutput.c_str())) {
        // replace the exact match for the string
        cmSystemTools::ReplaceString(
          this->ProcessOutput, this->TestHandler->DartStuff1.match(1).c_str(),
          "");
      }
    }
  }
}